

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

int fe_read_frame_int16(fe_t *fe,int16 *in,int32 len)

{
  int iVar1;
  long lVar2;
  int local_20;
  int local_1c;
  int i;
  int32 len_local;
  int16 *in_local;
  fe_t *fe_local;
  
  local_1c = len;
  if (fe->frame_size < len) {
    local_1c = (int)fe->frame_size;
  }
  memcpy(fe->spch,in,(long)local_1c << 1);
  if (fe->swap != '\0') {
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      fe->spch[local_20] = (ushort)fe->spch[local_20] >> 8 | fe->spch[local_20] << 8;
    }
  }
  if (fe->dither != '\0') {
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      lVar2 = genrand_int31();
      fe->spch[local_20] = fe->spch[local_20] + (ushort)(lVar2 % 4 == 0);
    }
  }
  iVar1 = fe_spch_to_frame(fe,local_1c);
  return iVar1;
}

Assistant:

int
fe_read_frame_int16(fe_t * fe, int16 const *in, int32 len)
{
    int i;

    if (len > fe->frame_size)
        len = fe->frame_size;

    /* Read it into the raw speech buffer. */
    memcpy(fe->spch, in, len * sizeof(*in));
    /* Swap and dither if necessary. */
    if (fe->swap)
        for (i = 0; i < len; ++i)
            SWAP_INT16(&fe->spch[i]);
    if (fe->dither)
        for (i = 0; i < len; ++i)
            fe->spch[i] += (int16) ((!(s3_rand_int31() % 4)) ? 1 : 0);

    return fe_spch_to_frame(fe, len);
}